

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_net.cpp
# Opt level: O1

int libtorrent::aux::anon_unknown_4::nl_dump_request
              (int sock,uint32_t seq,nlmsghdr *request_msg,function<void_(const_nlmsghdr_*)> *on_msg
              )

{
  _Manager_type p_Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ssize_t sVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  nlmsghdr *pnVar9;
  function<void_(const_nlmsghdr_*)> *pfVar10;
  socklen_t sock_addr_len;
  sockaddr_nl sock_addr;
  _Any_data local_1068;
  _Manager_type local_1058;
  _Invoker_type local_1050;
  nlmsghdr *local_1048;
  socklen_t local_1040;
  undefined1 local_103c [4108];
  
  request_msg->nlmsg_flags = 0x301;
  request_msg->nlmsg_seq = seq;
  request_msg->nlmsg_pid = 0;
  sVar5 = send(sock,request_msg,(ulong)request_msg->nlmsg_len,0);
  if (-1 < sVar5) {
    local_1040 = 0xc;
    iVar3 = getsockname(sock,(sockaddr *)local_103c,&local_1040);
    if (-1 < iVar3) {
      local_1068._M_unused._M_object = (void *)0x0;
      local_1068._8_8_ = 0;
      local_1058 = (_Manager_type)0x0;
      local_1050 = on_msg->_M_invoker;
      p_Var1 = (on_msg->super__Function_base)._M_manager;
      pfVar10 = on_msg;
      if (p_Var1 != (_Manager_type)0x0) {
        local_1068._M_unused._0_8_ =
             (undefined8)*(undefined8 *)&(on_msg->super__Function_base)._M_functor;
        local_1068._8_8_ = *(undefined8 *)((long)&(on_msg->super__Function_base)._M_functor + 8);
        pfVar10 = (function<void_(const_nlmsghdr_*)> *)&(on_msg->super__Function_base)._M_manager;
        *(_Manager_type *)pfVar10 = (_Manager_type)0x0;
        on_msg->_M_invoker = (_Invoker_type)0x0;
        local_1058 = p_Var1;
      }
      do {
        uVar6 = recv(sock,local_103c + 0xc,0x1000,0);
        uVar8 = (uint)uVar6;
        if ((int)uVar8 < 0) {
          bVar2 = false;
          pfVar10 = (function<void_(const_nlmsghdr_*)> *)0xffffffff;
        }
        else {
          bVar2 = true;
          if (0xf < (int)uVar8) {
            pnVar9 = (nlmsghdr *)(local_103c + 0xc);
            uVar6 = uVar6 & 0xffffffff;
            do {
              uVar4 = pnVar9->nlmsg_len;
              if ((uVar4 < 0x10) || ((uint)uVar6 < uVar4)) break;
              if ((uVar8 < uVar4) || ((pnVar9->nlmsg_type == 2 || (pnVar9->nlmsg_seq != seq)))) {
                pfVar10 = (function<void_(const_nlmsghdr_*)> *)0xffffffff;
LAB_001b4dd9:
                bVar2 = false;
                goto LAB_001b4ddd;
              }
              if (pnVar9->nlmsg_pid != local_103c._4_4_) {
                pfVar10 = (function<void_(const_nlmsghdr_*)> *)0xffffffff;
                goto LAB_001b4dd9;
              }
              if (pnVar9->nlmsg_type == 3) {
LAB_001b4dcb:
                pfVar10 = (function<void_(const_nlmsghdr_*)> *)0x0;
                goto LAB_001b4dd9;
              }
              local_1048 = pnVar9;
              if (local_1058 == (_Manager_type)0x0) {
                ::std::__throw_bad_function_call();
              }
              (*local_1050)(&local_1068,&local_1048);
              if ((pnVar9->nlmsg_flags & 2) == 0) goto LAB_001b4dcb;
              uVar4 = pnVar9->nlmsg_len + 3 & 0xfffffffc;
              uVar7 = (uint)uVar6 - uVar4;
              uVar6 = (ulong)uVar7;
              pnVar9 = (nlmsghdr *)((long)&pnVar9->nlmsg_len + (ulong)uVar4);
            } while (0xf < (int)uVar7);
            pfVar10 = (function<void_(const_nlmsghdr_*)> *)((ulong)pfVar10 & 0xffffffff);
          }
        }
LAB_001b4ddd:
        if (!bVar2) {
          if (local_1058 == (_Manager_type)0x0) {
            return (int)pfVar10;
          }
          (*local_1058)(&local_1068,&local_1068,__destroy_functor);
          return (int)pfVar10;
        }
      } while( true );
    }
  }
  return -1;
}

Assistant:

int nl_dump_request(int const sock, std::uint32_t const seq
		, nlmsghdr* const request_msg, std::function<void(nlmsghdr const*)> on_msg)
	{
		request_msg->nlmsg_flags = NLM_F_DUMP | NLM_F_REQUEST;
		request_msg->nlmsg_seq = seq;
		// in theory nlmsg_pid should be set to the netlink port ID (NOT the process ID)
		// of the sender, but the kernel ignores this field so it is typically set to
		// zero
		request_msg->nlmsg_pid = 0;

		if (::send(sock, request_msg, request_msg->nlmsg_len, 0) < 0)
			return -1;

		// get the socket's port ID so that we can verify it in the response
		sockaddr_nl sock_addr;
		socklen_t sock_addr_len = sizeof(sock_addr);
		if (::getsockname(sock, reinterpret_cast<sockaddr*>(&sock_addr), &sock_addr_len) < 0)
			return -1;

		return read_nl_sock(sock, seq, sock_addr.nl_pid, std::move(on_msg));
	}